

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void __thiscall TestSuite::ThreadHolder::~ThreadHolder(ThreadHolder *this)

{
  undefined8 in_RDI;
  ThreadHolder *unaff_retaddr;
  
  join(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  ThreadInternalArgs::~ThreadInternalArgs((ThreadInternalArgs *)0x11759d);
  std::function<void_(TestSuite::ThreadArgs_*)>::~function
            ((function<void_(TestSuite::ThreadArgs_*)> *)0x1175ab);
  return;
}

Assistant:

~ThreadHolder() { join(true); }